

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

int Abc_NodeCollapse1(Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins,int *pPermFanin,
                     int *pPermFanout)

{
  Hop_Obj_t *pHVar1;
  Abc_Obj_t *pObj;
  int iVar2;
  long lVar3;
  
  if ((pFanin->pNtk->ntkFunc != ABC_FUNC_AIG) || (pFanin->pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsAigLogic(pFanin->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcMinBase.c"
                  ,0x239,
                  "int Abc_NodeCollapse1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)");
  }
  if ((*(uint *)&pFanin->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcMinBase.c"
                  ,0x23a,
                  "int Abc_NodeCollapse1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)");
  }
  if ((*(uint *)&pFanout->field_0x14 & 0xf) == 7) {
    pHVar1 = Abc_NodeCollapseFunc1(pFanin,pFanout,vFanins,pPermFanin,pPermFanout);
    if (pHVar1 == (Hop_Obj_t *)0x0) {
      iVar2 = 0;
    }
    else {
      pObj = Abc_NtkCreateObj(pFanin->pNtk,ABC_OBJ_NODE);
      if (0 < vFanins->nSize) {
        lVar3 = 0;
        do {
          Abc_ObjAddFanin(pObj,(Abc_Obj_t *)vFanins->pArray[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < vFanins->nSize);
      }
      (pObj->field_5).pData = pHVar1;
      Abc_ObjTransferFanout(pFanout,pObj);
      if ((pFanout->vFanouts).nSize != 0) {
        __assert_fail("Abc_ObjFanoutNum( pFanout ) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcMinBase.c"
                      ,0x246,
                      "int Abc_NodeCollapse1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)");
      }
      iVar2 = 1;
      Abc_NtkDeleteObj_rec(pFanout,1);
    }
    return iVar2;
  }
  __assert_fail("Abc_ObjIsNode(pFanout)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcMinBase.c"
                ,0x23b,"int Abc_NodeCollapse1(Abc_Obj_t *, Abc_Obj_t *, Vec_Ptr_t *, int *, int *)")
  ;
}

Assistant:

int Abc_NodeCollapse1( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins, int * pPermFanin, int * pPermFanout )
{
    Abc_Obj_t * pFanoutNew, * pObj;
    Hop_Obj_t * bFanoutNew;
    int i;
    assert( Abc_NtkIsAigLogic(pFanin->pNtk) );
    assert( Abc_ObjIsNode(pFanin) );
    assert( Abc_ObjIsNode(pFanout) );
    bFanoutNew = Abc_NodeCollapseFunc1( pFanin, pFanout, vFanins, pPermFanin, pPermFanout );  
    if ( bFanoutNew == NULL )
        return 0;
    // create the new node
    pFanoutNew = Abc_NtkCreateNode( pFanin->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i )
        Abc_ObjAddFanin( pFanoutNew, pObj );
    pFanoutNew->pData = bFanoutNew;
    // transfer the fanout
    Abc_ObjTransferFanout( pFanout, pFanoutNew );
    assert( Abc_ObjFanoutNum( pFanout ) == 0 );
    Abc_NtkDeleteObj_rec( pFanout, 1 );
    return 1;
}